

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::split(Path *this,Path *dname,Path *bname)

{
  Path local_70;
  Path local_40;
  Path *local_20;
  Path *bname_local;
  Path *dname_local;
  Path *this_local;
  
  local_20 = bname;
  bname_local = dname;
  dname_local = this;
  dirname(&local_40,(char *)this);
  operator=(bname_local,&local_40);
  ~Path(&local_40);
  basename(&local_70,(char *)this);
  operator=(local_20,&local_70);
  ~Path(&local_70);
  return;
}

Assistant:

void Path::split(Path& dname, Path& bname) const
{
  dname = dirname();
  bname = basename();
}